

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchmanager.cpp
# Opt level: O0

IPalSynchronizationManager *
CorUnix::CPalSynchronizationManager::CreatePalSynchronizationManager(void)

{
  IPalSynchronizationManager *local_10;
  IPalSynchronizationManager *pRet;
  
  local_10 = (IPalSynchronizationManager *)0x0;
  if (s_pObjSynchMgr == (IPalSynchronizationManager *)0x0) {
    Initialize();
    local_10 = s_pObjSynchMgr;
  }
  else {
    fprintf(_stderr,"] %s %s:%d","CreatePalSynchronizationManager",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
            ,0x5c2);
    fprintf(_stderr,"Multiple PAL Synchronization manager initializations\n");
  }
  return local_10;
}

Assistant:

IPalSynchronizationManager * CPalSynchronizationManager::CreatePalSynchronizationManager()
    {
        IPalSynchronizationManager * pRet = NULL;
        if (s_pObjSynchMgr == NULL)
        {
            Initialize();
            pRet = static_cast<IPalSynchronizationManager *>(s_pObjSynchMgr);
        }
        else
        {
            ASSERT("Multiple PAL Synchronization manager initializations\n");
        }

        return pRet;
    }